

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

bool __thiscall llvm::StringRef::getAsDouble(StringRef *this,double *Result,bool AllowInexact)

{
  opStatus oVar1;
  fltSemantics *pfVar2;
  bool bVar3;
  double dVar4;
  APFloat F;
  undefined1 local_40 [8];
  Storage local_38;
  
  APFloat::APFloat((APFloat *)local_40,0.0);
  oVar1 = APFloat::convertFromString((APFloat *)local_40,*this,rmNearestTiesToEven);
  if ((oVar1 == opOK) || (bVar3 = true, AllowInexact && (oVar1 & opInexact) != opOK)) {
    pfVar2 = APFloatBase::PPCDoubleDouble();
    if (pfVar2 != local_38.semantics) {
      local_38.IEEE.significand = (Significand)local_40;
    }
    dVar4 = detail::IEEEFloat::convertToDouble((IEEEFloat *)((long)local_38.IEEE.significand + 8));
    *Result = dVar4;
    bVar3 = false;
  }
  APFloat::Storage::~Storage((Storage *)(local_40 + 8));
  return bVar3;
}

Assistant:

bool StringRef::getAsDouble(double &Result, bool AllowInexact) const {
  APFloat F(0.0);
  APFloat::opStatus Status =
      F.convertFromString(*this, APFloat::rmNearestTiesToEven);
  if (Status != APFloat::opOK) {
    if (!AllowInexact || !(Status & APFloat::opInexact))
      return true;
  }

  Result = F.convertToDouble();
  return false;
}